

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

char * cft_args_get_autotune_metric_label(fasttext_args_t *handle)

{
  char *pcVar1;
  Args *in_stack_00000078;
  string local_28 [40];
  
  fasttext::Args::getAutotuneMetricLabel_abi_cxx11_(in_stack_00000078);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  std::__cxx11::string::~string(local_28);
  return pcVar1;
}

Assistant:

const char* cft_args_get_autotune_metric_label(fasttext_args_t *handle) {
    return strdup(((Args*)handle)->getAutotuneMetricLabel().c_str());
}